

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_3.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Date *d)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,'(');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,d->y);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,d->m);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,d->d);
  poVar1 = std::operator<<(poVar1,')');
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Date& d)
{
	return os << '(' << d.year()
		<< ',' << d.month()
		<< ',' << d.day() << ')';
}